

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.h
# Opt level: O2

size_t __thiscall axl::sl::PackerSeq::append<axl::sl::Pack<unsigned_char>>(PackerSeq *this)

{
  Packer *packer;
  size_t sVar1;
  
  packer = &PackerImpl<axl::sl::Pack<unsigned_char>_>::getSingleton()->super_Packer;
  sVar1 = append(this,packer);
  return sVar1;
}

Assistant:

size_t
	append() {
		return append(PackerImpl<T>::getSingleton());
	}